

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O3

RC __thiscall RM_FileHandle::UpdateRec(RM_FileHandle *this,RM_Record *rec)

{
  PF_FileHandle *this_00;
  int iVar1;
  RC RVar2;
  RC RVar3;
  RC RVar4;
  int iVar5;
  size_t __n;
  RM_FileHandle *this_01;
  PageNum page;
  SlotNum slot;
  RID rid;
  PF_PageHandle ph;
  char *recData;
  char *pData;
  PageNum local_60;
  int local_5c;
  RID local_58;
  PF_PageHandle local_50;
  char *local_40;
  char *local_38;
  
  RVar2 = 0x6a;
  if (this->openedFH == true) {
    RID::RID(&local_58);
    this_01 = (RM_FileHandle *)rec;
    RVar2 = RM_Record::GetRid(rec,&local_58);
    if ((RVar2 == 0) &&
       (RVar2 = GetPageNumAndSlot(this_01,&local_58,&local_60,&local_5c), RVar2 == 0)) {
      PF_PageHandle::PF_PageHandle(&local_50);
      this_00 = &this->pfh;
      RVar2 = PF_FileHandle::GetThisPage(this_00,local_60,&local_50);
      if (RVar2 == 0) {
        RVar3 = PF_PageHandle::GetData(&local_50,&local_38);
        if ((RVar3 == 0) && (RVar3 = 0x68, local_5c <= (this->header).numRecordsPerPage)) {
          iVar1 = (this->header).bitmapOffset;
          iVar5 = local_5c + 7;
          if (-1 < local_5c) {
            iVar5 = local_5c;
          }
          if (((uint)(int)local_38[(long)(iVar5 >> 3) + (long)iVar1] >> (local_5c % 8 & 0x1fU) & 1)
              == 0) {
            RVar3 = 0x67;
          }
          else {
            RVar3 = RM_Record::GetData(rec,&local_40);
            if (RVar3 == 0) {
              __n = (size_t)(this->header).recordSize;
              memcpy(local_38 + (long)local_5c * __n + (long)(this->header).bitmapSize + (long)iVar1
                     ,local_40,__n);
              RVar3 = 0;
            }
          }
        }
        RVar2 = PF_FileHandle::MarkDirty(this_00,local_60);
        if ((RVar2 == 0) &&
           (RVar4 = PF_FileHandle::UnpinPage(this_00,local_60), RVar2 = RVar3, RVar4 != 0)) {
          RVar2 = RVar4;
        }
      }
      PF_PageHandle::~PF_PageHandle(&local_50);
    }
    RID::~RID(&local_58);
  }
  return RVar2;
}

Assistant:

RC RM_FileHandle::UpdateRec (const RM_Record &rec) {
  // only proceed if this filehandle is associated with an open file
  if (!isValidFH())
    return (RM_INVALIDFILE);
  RC rc = 0;

  // retrieves the page and slot number of the record
  RID rid;
  if((rc = rec.GetRid(rid)))
    return (rc);
  PageNum page;
  SlotNum slot;
  if((rc = GetPageNumAndSlot(rid, page, slot)))
    return (rc);

  // gets the page, bitmap and pageheader for this page that holds the record
  PF_PageHandle ph;
  if((rc = pfh.GetThisPage(page, ph)))
    return (rc);
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    goto cleanup_and_exit;

  // Check if there really exists a record here according to the header
  bool recordExists;
  if ((rc = CheckBitSet(bitmap, header.numRecordsPerPage, slot, recordExists)))
    goto cleanup_and_exit;
  if(!recordExists){
    rc = RM_INVALIDRECORD;
    goto cleanup_and_exit;
  }
  
  // updates its contents
  char * recData;
  if((rc = rec.GetData(recData)))
    goto cleanup_and_exit;
  memcpy(bitmap + (header.bitmapSize) + slot*(header.recordSize),
    recData, header.recordSize);

  // always unpin the page before returning
  cleanup_and_exit:
  RC rc2;
  if((rc2 = pfh.MarkDirty(page)) || (rc2 = pfh.UnpinPage(page)))
    return (rc2);
  return (rc); 
}